

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptProxy::StrictEquals
          (JavascriptProxy *this,Var other,BOOL *value,ScriptContext *requestContext)

{
  bool bVar1;
  ThreadContext *this_00;
  ThreadContext *threadContext;
  ScriptContext *requestContext_local;
  BOOL *value_local;
  Var other_local;
  JavascriptProxy *this_local;
  
  *value = 0;
  bVar1 = IsRevoked(this);
  if (!bVar1) {
    this_00 = ScriptContext::GetThreadContext(requestContext);
    bVar1 = ThreadContext::IsDisableImplicitCall(this_00);
    if (bVar1) {
      ThreadContext::AddImplicitCallFlags(this_00,ImplicitCall_External);
    }
    else {
      *value = (uint)((JavascriptProxy *)other == this);
    }
    this_local._4_4_ = (uint)!bVar1;
    return this_local._4_4_;
  }
  JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"strict equal");
}

Assistant:

BOOL JavascriptProxy::StrictEquals(__in Var other, __out BOOL* value, ScriptContext* requestContext)
    {
        *value = FALSE;
        //RecyclableObject* targetObj;
        if (IsRevoked())
        {
            // the proxy has been revoked; TypeError.
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("strict equal"));
        }
        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }
        *value = (other == this);
        return true;
    }